

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall
wabt::TypeChecker::CheckReturnSignature
          (TypeChecker *this,TypeVector *actual,TypeVector *expected,char *desc)

{
  Result RVar1;
  string local_70;
  string local_50;
  
  RVar1 = CheckTypes(this,actual,expected);
  if (RVar1.enum_ == Error) {
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)expected,(TypeVector *)0x0,desc);
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)actual,(TypeVector *)0x0,desc);
    PrintError(this,"return signatures have inconsistent types: expected %s, got %s",
               local_50._M_dataplus._M_p,local_70._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckReturnSignature(const TypeVector& actual,
                                         const TypeVector& expected,
                                         const char* desc) {
  Result result = CheckTypes(actual, expected);
  if (Failed(result)) {
    PrintError("return signatures have inconsistent types: expected %s, got %s",
               TypesToString(expected).c_str(), TypesToString(actual).c_str());
  }
  return result;
}